

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleighbase.hh
# Opt level: O2

void __thiscall SleighBase::~SleighBase(SleighBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool isInitialized(void) const { return (root != (SubtableSymbol *)0); }